

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# citylots_std.cpp
# Opt level: O1

void * parseObject(SymbolContext<char> *ctx)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  JSONValue *this;
  bool bVar2;
  int iVar3;
  JSONValue *pJVar4;
  string local_60;
  string local_40;
  
  if (ctx->num_values != 0) {
    this = (JSONValue *)*ctx->values;
    if (this->type == Object) {
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"type","");
      bVar2 = JSONValue::has_item(this,&local_40);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p != &local_40.field_2) {
        operator_delete(local_40._M_dataplus._M_p);
      }
    }
    else {
      bVar2 = false;
    }
    if (bVar2 == false) {
      return this;
    }
    paVar1 = &local_60.field_2;
    local_60._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"type","");
    pJVar4 = JSONValue::operator[](this,&local_60);
    if (pJVar4->type != String) {
      __assert_fail("type == JSONType::String",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/benchmarks/cpp/citylots_std.cpp"
                    ,0x6e,"const JSONString &JSONValue::str() const");
    }
    iVar3 = std::__cxx11::string::compare((char *)(pJVar4->field_1).svalue);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != paVar1) {
      operator_delete(local_60._M_dataplus._M_p);
    }
    if (iVar3 != 0) {
      return this;
    }
    local_60._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"properties","");
    bVar2 = JSONValue::has_item(this,&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != paVar1) {
      operator_delete(local_60._M_dataplus._M_p);
    }
    if (!bVar2) {
      return this;
    }
    local_60._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"properties","");
    pJVar4 = JSONValue::operator[](this,&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != paVar1) {
      operator_delete(local_60._M_dataplus._M_p);
    }
    local_60._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"STREET","");
    bVar2 = JSONValue::has_item(pJVar4,&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != paVar1) {
      operator_delete(local_60._M_dataplus._M_p);
    }
    if (!bVar2) {
      return this;
    }
    local_60._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"STREET","");
    pJVar4 = JSONValue::operator[](pJVar4,&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != paVar1) {
      operator_delete(local_60._M_dataplus._M_p);
    }
    if (pJVar4->type != String) {
      return this;
    }
    iVar3 = std::__cxx11::string::compare((char *)(pJVar4->field_1).svalue);
    if (iVar3 == 0) {
      return this;
    }
    JSONValue::~JSONValue(this);
    operator_delete(this);
  }
  return (void *)0x0;
}

Assistant:

void *parseObject(const SymbolContext<char>& ctx)
{
    if (ctx.count() == 0) return nullptr;

    JSONValue *v = ctx.value<JSONValue>(1);

    if (v->is_object() && v->has_item("type"))
    {
        if (v->operator[]("type").str() == "Feature")
        {
            if (v->has_item("properties"))
            {
                const JSONValue& properties = v->operator[]("properties");

                if (properties.has_item("STREET"))
                {
                    const JSONValue& street = properties.operator[]("STREET");
                    if (street.is_str())
                    {
                        if (street.str() != "JEFFERSON")
                        {
                            delete v;
                            return nullptr;
                        }
                        else
                        {
                            // count++;
                        }
                    }
                    else
                    {
                        // count++;
                    }
                }
            }
        }
    }
    return v;
}